

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodetxb_sse2.c
# Opt level: O0

void get_8_coeff_contexts_hor(uint8_t *levels,int width,ptrdiff_t *offsets,int8_t *coeff_contexts)

{
  undefined8 *in_RCX;
  int in_ESI;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qb;
  __m128i level [5];
  __m128i count;
  int col;
  __m128i pos_to_offset;
  __m128i pos_to_offset_large;
  int stride;
  __m128i *in_stack_fffffffffffffe68;
  undefined5 in_stack_fffffffffffffe70;
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  int in_stack_fffffffffffffe7c;
  uint8_t *in_stack_fffffffffffffe80;
  undefined8 local_138;
  undefined8 uStack_130;
  int local_11c;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 *local_f0;
  char local_b8;
  char cStack_b7;
  char cStack_b6;
  char cStack_b5;
  char cStack_b4;
  char cStack_b3;
  char cStack_b2;
  char cStack_b1;
  char cStack_b0;
  char cStack_af;
  char cStack_ae;
  char cStack_ad;
  char cStack_ac;
  char cStack_ab;
  char cStack_aa;
  char cStack_a9;
  char local_a8;
  char cStack_a7;
  char cStack_a6;
  char cStack_a5;
  char cStack_a4;
  char cStack_a3;
  char cStack_a2;
  char cStack_a1;
  char cStack_a0;
  char cStack_9f;
  char cStack_9e;
  char cStack_9d;
  char cStack_9c;
  char cStack_9b;
  char cStack_9a;
  char cStack_99;
  
  uVar1 = 0x24;
  uVar2 = 0x1f;
  uVar3 = 0x1a;
  local_11c = in_ESI;
  local_118 = 0x1a1a1a1a1a1a1a1a;
  uStack_110 = 0x1f1f1f1f1f1f1f1f;
  local_f0 = in_RCX;
  do {
    load_levels_8x2x5_sse2
              (in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c,
               (ptrdiff_t *)
               CONCAT17(uVar3,CONCAT16(uVar2,CONCAT15(uVar1,in_stack_fffffffffffffe70))),
               in_stack_fffffffffffffe68);
    get_coeff_contexts_kernel_sse2((__m128i *)&stack0xfffffffffffffe78);
    local_a8 = (char)extraout_XMM0_Qa;
    cStack_a7 = (char)((ulong)extraout_XMM0_Qa >> 8);
    cStack_a6 = (char)((ulong)extraout_XMM0_Qa >> 0x10);
    cStack_a5 = (char)((ulong)extraout_XMM0_Qa >> 0x18);
    cStack_a4 = (char)((ulong)extraout_XMM0_Qa >> 0x20);
    cStack_a3 = (char)((ulong)extraout_XMM0_Qa >> 0x28);
    cStack_a2 = (char)((ulong)extraout_XMM0_Qa >> 0x30);
    cStack_a1 = (char)((ulong)extraout_XMM0_Qa >> 0x38);
    cStack_a0 = (char)extraout_XMM0_Qb;
    cStack_9f = (char)((ulong)extraout_XMM0_Qb >> 8);
    cStack_9e = (char)((ulong)extraout_XMM0_Qb >> 0x10);
    cStack_9d = (char)((ulong)extraout_XMM0_Qb >> 0x18);
    cStack_9c = (char)((ulong)extraout_XMM0_Qb >> 0x20);
    cStack_9b = (char)((ulong)extraout_XMM0_Qb >> 0x28);
    cStack_9a = (char)((ulong)extraout_XMM0_Qb >> 0x30);
    cStack_99 = (char)((ulong)extraout_XMM0_Qb >> 0x38);
    local_b8 = (char)local_118;
    cStack_b7 = (char)((ulong)local_118 >> 8);
    cStack_b6 = (char)((ulong)local_118 >> 0x10);
    cStack_b5 = (char)((ulong)local_118 >> 0x18);
    cStack_b4 = (char)((ulong)local_118 >> 0x20);
    cStack_b3 = (char)((ulong)local_118 >> 0x28);
    cStack_b2 = (char)((ulong)local_118 >> 0x30);
    cStack_b1 = (char)((ulong)local_118 >> 0x38);
    cStack_b0 = (char)uStack_110;
    cStack_af = (char)((ulong)uStack_110 >> 8);
    cStack_ae = (char)((ulong)uStack_110 >> 0x10);
    cStack_ad = (char)((ulong)uStack_110 >> 0x18);
    cStack_ac = (char)((ulong)uStack_110 >> 0x20);
    cStack_ab = (char)((ulong)uStack_110 >> 0x28);
    cStack_aa = (char)((ulong)uStack_110 >> 0x30);
    cStack_a9 = (char)((ulong)uStack_110 >> 0x38);
    local_138 = CONCAT17(cStack_a1 + cStack_b1,
                         CONCAT16(cStack_a2 + cStack_b2,
                                  CONCAT15(cStack_a3 + cStack_b3,
                                           CONCAT14(cStack_a4 + cStack_b4,
                                                    CONCAT13(cStack_a5 + cStack_b5,
                                                             CONCAT12(cStack_a6 + cStack_b6,
                                                                      CONCAT11(cStack_a7 + cStack_b7
                                                                               ,local_a8 + local_b8)
                                                                     ))))));
    uStack_130 = CONCAT17(cStack_99 + cStack_a9,
                          CONCAT16(cStack_9a + cStack_aa,
                                   CONCAT15(cStack_9b + cStack_ab,
                                            CONCAT14(cStack_9c + cStack_ac,
                                                     CONCAT13(cStack_9d + cStack_ad,
                                                              CONCAT12(cStack_9e + cStack_ae,
                                                                       CONCAT11(cStack_9f +
                                                                                cStack_af,
                                                                                cStack_a0 +
                                                                                cStack_b0)))))));
    *local_f0 = local_138;
    local_f0[1] = uStack_130;
    local_f0 = local_f0 + 2;
    local_11c = local_11c + -2;
    local_118 = 0x2424242424242424;
    uStack_110 = 0x2424242424242424;
  } while (local_11c != 0);
  return;
}

Assistant:

static inline void get_8_coeff_contexts_hor(const uint8_t *levels,
                                            const int width,
                                            const ptrdiff_t *const offsets,
                                            int8_t *coeff_contexts) {
  const int stride = 8 + TX_PAD_HOR;
  const __m128i pos_to_offset_large = _mm_set1_epi8(SIG_COEF_CONTEXTS_2D + 10);
  __m128i pos_to_offset =
      _mm_setr_epi8(SIG_COEF_CONTEXTS_2D + 0, SIG_COEF_CONTEXTS_2D + 0,
                    SIG_COEF_CONTEXTS_2D + 0, SIG_COEF_CONTEXTS_2D + 0,
                    SIG_COEF_CONTEXTS_2D + 0, SIG_COEF_CONTEXTS_2D + 0,
                    SIG_COEF_CONTEXTS_2D + 0, SIG_COEF_CONTEXTS_2D + 0,
                    SIG_COEF_CONTEXTS_2D + 5, SIG_COEF_CONTEXTS_2D + 5,
                    SIG_COEF_CONTEXTS_2D + 5, SIG_COEF_CONTEXTS_2D + 5,
                    SIG_COEF_CONTEXTS_2D + 5, SIG_COEF_CONTEXTS_2D + 5,
                    SIG_COEF_CONTEXTS_2D + 5, SIG_COEF_CONTEXTS_2D + 5);
  int col = width;
  __m128i count;
  __m128i level[5];

  assert(!(width % 2));

  do {
    load_levels_8x2x5_sse2(levels, stride, offsets, level);
    count = get_coeff_contexts_kernel_sse2(level);
    count = _mm_add_epi8(count, pos_to_offset);
    _mm_store_si128((__m128i *)coeff_contexts, count);
    pos_to_offset = pos_to_offset_large;
    levels += 2 * stride;
    coeff_contexts += 16;
    col -= 2;
  } while (col);
}